

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlInitializeCatalog(void)

{
  char *cur_00;
  xmlCatalogPtr pxVar1;
  xmlCatalogPtr pxVar2;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar3;
  bool bVar4;
  xmlCatalogEntryPtr local_38;
  xmlCatalogEntryPtr *nextent;
  xmlCatalogPtr catal;
  char *paths;
  char *cur;
  char *path;
  char *catalogs;
  
  if (xmlCatalogInitialized == 0) {
    xmlInitParser();
    xmlRMutexLock(&xmlCatalogMutex);
    pxVar1 = xmlDefaultCatalog;
    if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
      path = getenv("XML_CATALOG_FILES");
      if (path == (char *)0x0) {
        path = "file:///usr/local/etc/xml/catalog";
      }
      pxVar2 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
      pxVar1 = xmlDefaultCatalog;
      if (pxVar2 != (xmlCatalogPtr)0x0) {
        paths = path;
        local_38 = (xmlCatalogEntryPtr)&pxVar2->xml;
        while (pxVar1 = pxVar2, *paths != '\0') {
          while( true ) {
            cur_00 = paths;
            bVar4 = true;
            if ((*paths != ' ') && ((*paths < '\t' || (bVar4 = true, '\n' < *paths)))) {
              bVar4 = *paths == '\r';
            }
            if (!bVar4) break;
            paths = paths + 1;
          }
          if (*paths != '\0') {
            while( true ) {
              bVar4 = false;
              if (*paths != '\0') {
                bVar4 = true;
                if ((*paths != ' ') && ((*paths < '\t' || (bVar4 = true, '\n' < *paths)))) {
                  bVar4 = *paths == '\r';
                }
                bVar4 = (bool)(bVar4 ^ 1);
              }
              if (!bVar4) break;
              paths = paths + 1;
            }
            URL = xmlStrndup((xmlChar *)cur_00,(int)paths - (int)cur_00);
            if (URL != (xmlChar *)0x0) {
              pxVar3 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,URL,
                                          xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
              local_38->next = pxVar3;
              if (local_38->next != (xmlCatalogEntryPtr)0x0) {
                local_38 = local_38->next;
              }
              (*xmlFree)(URL);
            }
          }
        }
      }
    }
    xmlDefaultCatalog = pxVar1;
    xmlRMutexUnlock(&xmlCatalogMutex);
    xmlCatalogInitialized = 1;
  }
  return;
}

Assistant:

void
xmlInitializeCatalog(void) {
    if (xmlCatalogInitialized != 0)
	return;

    xmlInitParser();

    xmlRMutexLock(&xmlCatalogMutex);

    if (xmlDefaultCatalog == NULL) {
	const char *catalogs;
	char *path;
	const char *cur, *paths;
	xmlCatalogPtr catal;
	xmlCatalogEntryPtr *nextent;

	catalogs = (const char *) getenv("XML_CATALOG_FILES");
	if (catalogs == NULL)
	    catalogs = XML_XML_DEFAULT_CATALOG;

	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		xmlCatalogDefaultPrefer);
	if (catal != NULL) {
	    /* the XML_CATALOG_FILES envvar is allowed to contain a
	       space-separated list of entries. */
	    cur = catalogs;
	    nextent = &catal->xml;
	    while (*cur != '\0') {
		while (xmlIsBlank_ch(*cur))
		    cur++;
		if (*cur != 0) {
		    paths = cur;
		    while ((*cur != 0) && (!xmlIsBlank_ch(*cur)))
			cur++;
		    path = (char *) xmlStrndup((const xmlChar *)paths, cur - paths);
		    if (path != NULL) {
			*nextent = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				NULL, BAD_CAST path, xmlCatalogDefaultPrefer, NULL);
			if (*nextent != NULL)
			    nextent = &((*nextent)->next);
			xmlFree(path);
		    }
		}
	    }
	    xmlDefaultCatalog = catal;
	}
    }

    xmlRMutexUnlock(&xmlCatalogMutex);

    xmlCatalogInitialized = 1;
}